

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdaref_expression.cpp
# Opt level: O2

void __thiscall
duckdb::LambdaRefExpression::LambdaRefExpression
          (LambdaRefExpression *this,idx_t lambda_idx,string *column_name_p)

{
  (this->super_ParsedExpression).super_BaseExpression.type = LAMBDA_REF;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = LAMBDA_REF;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__LambdaRefExpression_027a73a0;
  this->lambda_idx = lambda_idx;
  ::std::__cxx11::string::string((string *)&this->column_name,(string *)column_name_p);
  ::std::__cxx11::string::_M_assign
            ((string *)&(this->super_ParsedExpression).super_BaseExpression.alias);
  return;
}

Assistant:

LambdaRefExpression::LambdaRefExpression(idx_t lambda_idx, string column_name_p)
    : ParsedExpression(ExpressionType::LAMBDA_REF, ExpressionClass::LAMBDA_REF), lambda_idx(lambda_idx),
      column_name(std::move(column_name_p)) {
	alias = column_name;
}